

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryMappingTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::memory::anon_unknown_0::RandomMemoryMappingInstance::iterate
          (TestStatus *__return_storage_ptr__,RandomMemoryMappingInstance *this)

{
  Random *pRVar1;
  vector<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
  *vec;
  vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
  *vec_00;
  pointer *pppMVar2;
  uint *puVar3;
  uchar uVar4;
  uchar uVar5;
  uint uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  pointer ppMVar9;
  __normal_iterator<vkt::memory::(anonymous_namespace)::MemoryObject_**,_std::vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>_>
  first;
  __normal_iterator<vkt::memory::(anonymous_namespace)::MemoryObject_**,_std::vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>_>
  last;
  ReferenceMemory *pRVar10;
  _Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
  *p_Var11;
  pointer pMVar12;
  PlatformMemoryLimits *pPVar13;
  pointer ppMVar14;
  TotalMemoryTracker *pTVar15;
  pointer puVar16;
  pointer puVar17;
  pointer puVar18;
  _Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
  *this_00;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  byte bVar25;
  MemoryObject_conflict *pMVar26;
  pointer pVVar27;
  RandomMemoryMappingInstance *pRVar28;
  pointer first_00;
  pointer last_00;
  byte bVar29;
  int iVar30;
  deUint32 dVar31;
  deUint32 dVar32;
  VkResult VVar33;
  MemoryObject_conflict *pMVar34;
  deUint64 dVar35;
  MemoryObject_conflict *pMVar36;
  VkDeviceSize VVar37;
  MemoryMapping *pMVar38;
  MemoryMapping *pMVar39;
  MemoryHeap *pMVar40;
  ulong uVar41;
  TestError *this_01;
  VkDeviceSize __n;
  size_t sVar42;
  pointer ppMVar43;
  bool value;
  bool value_00;
  ulong uVar44;
  ulong uVar45;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  int ndx;
  int iVar46;
  ulong uVar47;
  __normal_iterator<vkt::memory::(anonymous_namespace)::MemoryHeap_**,_std::vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>_>
  first_01;
  ulong uVar48;
  uint uVar49;
  size_t sVar50;
  size_t __n_00;
  int ndx_1;
  __normal_iterator<vkt::memory::(anonymous_namespace)::MemoryHeap_**,_std::vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>_>
  last_01;
  size_t ndx_3;
  long lVar51;
  pointer pSVar52;
  VkDeviceSize VVar53;
  pointer ppMVar54;
  VkDeviceSize VVar55;
  size_t rangeNdx;
  BitVector *this_02;
  bool bVar56;
  undefined1 value_01;
  float fVar57;
  MemoryObject_conflict *object;
  MemoryObject_conflict *pMStack_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  MemoryObject_conflict *object_1;
  MemoryObject_conflict *pMStack_e0;
  pointer local_d8;
  VkAllocationCallbacks *pVStack_d0;
  MemoryHeap *local_c0;
  DeviceInterface *local_b8;
  VkDevice local_b0;
  vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
  *local_a8;
  RandomMemoryMappingInstance *local_a0;
  vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
  nonEmptyHeaps;
  vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
  nonFullHeaps;
  MemoryObject_conflict *object_2;
  MemoryObject_conflict *local_38;
  
  local_b0 = Context::getDevice((this->super_TestInstance).m_context);
  local_b8 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  if ((this->m_memoryLimits).totalDeviceLocalMemory == 0) {
    VVar37 = (this->m_totalMemTracker).m_usage[1];
  }
  else {
    VVar37 = 0;
  }
  lVar51 = VVar37 + (this->m_totalMemTracker).m_usage[0];
  local_a0 = this;
  if ((this->m_memoryMappings).
      super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->m_memoryMappings).
      super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pRVar1 = &this->m_rng;
    fVar57 = deRandom_getFloat(&pRVar1->m_rnd);
    if (fVar57 < 0.5) {
      ppMVar9 = (this->m_memoryMappings).
                super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pMVar38 = (MemoryMapping *)0x0;
      iVar46 = 0;
      for (ppMVar43 = (this->m_memoryMappings).
                      super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppMVar43 != ppMVar9;
          ppMVar43 = ppMVar43 + 1) {
        if ((iVar46 < 1) || (iVar30 = de::Random::getInt(pRVar1,0,iVar46), iVar30 < 1)) {
          pMVar38 = *ppMVar43;
        }
        iVar46 = iVar46 + 1;
      }
      dVar31 = deRandom_getUint32(&pRVar1->m_rnd);
      dVar32 = deRandom_getUint32(&pRVar1->m_rnd);
      uVar47 = (ulong)dVar32 % 0x65;
      if (dVar31 % 3 == 0) {
        do {
          while( true ) {
            bVar56 = uVar47 == 0;
            uVar47 = uVar47 - 1;
            if (bVar56) goto LAB_00641002;
            dVar35 = de::Random::getUint64(pRVar1);
            uVar44 = dVar35 % (pMVar38->m_range).size;
            uVar4 = *(uchar *)((long)pMVar38->m_ptr + uVar44);
            uVar44 = uVar44 + (pMVar38->m_range).offset;
            pRVar10 = pMVar38->m_reference;
            uVar45 = uVar44 >> 5;
            puVar18 = (pRVar10->m_bytes).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start;
            uVar49 = 1 << ((byte)uVar44 & 0x1f);
            if (((pRVar10->m_defined).m_data.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar45] >> ((uint)uVar44 & 0x1f) & 1) != 0) break;
            puVar18[uVar44] = uVar4;
            puVar3 = (pRVar10->m_defined).m_data.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar45;
            *puVar3 = *puVar3 | uVar49;
          }
          uVar5 = puVar18[uVar44];
          puVar18[uVar44] = uVar4;
          puVar3 = (pRVar10->m_defined).m_data.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar45;
          *puVar3 = *puVar3 | uVar49;
        } while (uVar5 == uVar4);
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,(char *)0x0,"m_reference.read((size_t)(m_range.offset + pos), val)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryMappingTests.cpp"
                   ,0x256);
        goto LAB_0064119b;
      }
      if (dVar31 % 3 != 1) {
        lVar51 = (ulong)dVar32 % 0x65 + 1;
        do {
          lVar51 = lVar51 + -1;
          if (lVar51 == 0) goto LAB_00641002;
          dVar35 = de::Random::getUint64(pRVar1);
          uVar47 = dVar35 % (pMVar38->m_range).size;
          bVar25 = *(byte *)((long)pMVar38->m_ptr + uVar47);
          dVar31 = deRandom_getUint32(&pRVar1->m_rnd);
          bVar29 = (byte)dVar31 ^ bVar25;
          *(byte *)((long)pMVar38->m_ptr + uVar47) = bVar29;
          uVar47 = uVar47 + (pMVar38->m_range).offset;
          pRVar10 = pMVar38->m_reference;
          puVar18 = (pRVar10->m_bytes).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (((pRVar10->m_defined).m_data.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar47 >> 5] >> ((uint)uVar47 & 0x1f) & 1) == 0) {
            bVar56 = true;
          }
          else {
            bVar56 = puVar18[uVar47] == bVar25;
          }
          puVar18[uVar47] = bVar29;
          puVar3 = (pRVar10->m_defined).m_data.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start + (uVar47 >> 5);
          *puVar3 = *puVar3 | 1 << ((byte)uVar47 & 0x1f);
          auVar20._8_8_ = 0;
          auVar20._0_8_ = pRVar10->m_atomSize;
          auVar23._8_8_ = 0;
          auVar23._0_8_ = uVar47;
          bVar25 = SUB161(auVar23 / auVar20,0) & 0x1f;
          puVar3 = (pRVar10->m_flushed).m_data.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start + (SUB168(auVar23 / auVar20,0) >> 5);
          *puVar3 = *puVar3 & (-2 << bVar25 | 0xfffffffeU >> 0x20 - bVar25);
        } while (bVar56);
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,(char *)0x0,
                   "m_reference.modifyXor((size_t)(m_range.offset + pos), val, mask)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryMappingTests.cpp"
                   ,0x273);
        goto LAB_0064119b;
      }
      while (bVar56 = uVar47 != 0, uVar47 = uVar47 - 1, bVar56) {
        dVar35 = de::Random::getUint64(pRVar1);
        uVar44 = dVar35 % (pMVar38->m_range).size;
        dVar31 = deRandom_getUint32(&pRVar1->m_rnd);
        *(uchar *)((long)pMVar38->m_ptr + uVar44) = (uchar)dVar31;
        pRVar10 = pMVar38->m_reference;
        uVar44 = uVar44 + (pMVar38->m_range).offset;
        bVar25 = (byte)uVar44 & 0x1f;
        (pRVar10->m_bytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
        .super__Vector_impl_data._M_start[uVar44] = (uchar)dVar31;
        puVar3 = (pRVar10->m_defined).m_data.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start + (uVar44 >> 5);
        *puVar3 = *puVar3 | 1 << bVar25;
        auVar19._8_8_ = 0;
        auVar19._0_8_ = pRVar10->m_atomSize;
        auVar22._8_4_ = 0 << bVar25;
        auVar22._0_8_ = uVar44;
        auVar22._12_4_ = 0;
        bVar25 = SUB161(auVar22 / auVar19,0) & 0x1f;
        puVar3 = (pRVar10->m_flushed).m_data.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start + (SUB168(auVar22 / auVar19,0) >> 5);
        *puVar3 = *puVar3 & (-2 << bVar25 | 0xfffffffeU >> 0x20 - bVar25);
      }
      goto LAB_00641002;
    }
  }
  vec = &this->m_memoryMappings;
  vec_00 = &this->m_mappedMemoryObjects;
  if ((this->m_mappedMemoryObjects).
      super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->m_mappedMemoryObjects).
      super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pRVar1 = &this->m_rng;
    fVar57 = deRandom_getFloat(&pRVar1->m_rnd);
    first._M_current =
         (this->m_mappedMemoryObjects).
         super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
         ._M_impl.super__Vector_impl_data._M_start;
    last._M_current =
         (this->m_mappedMemoryObjects).
         super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (fVar57 < 0.4) {
      pMVar34 = de::Random::
                choose<vkt::memory::(anonymous_namespace)::MemoryObject*,__gnu_cxx::__normal_iterator<vkt::memory::(anonymous_namespace)::MemoryObject**,std::vector<vkt::memory::(anonymous_namespace)::MemoryObject*,std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject*>>>>
                          (pRVar1,first,last);
      bVar56 = de::Random::getBool(pRVar1);
      dVar31 = deRandom_getUint32(&pRVar1->m_rnd);
      uVar47 = (ulong)(dVar31 % 10 + 1);
      if (bVar56) {
        std::vector<vk::VkMappedMemoryRange,_std::allocator<vk::VkMappedMemoryRange>_>::vector
                  ((vector<vk::VkMappedMemoryRange,_std::allocator<vk::VkMappedMemoryRange>_> *)
                   &object,uVar47,(allocator_type *)&object_1);
        randomRanges(pRVar1,(vector<vk::VkMappedMemoryRange,_std::allocator<vk::VkMappedMemoryRange>_>
                             *)&object,uVar47,
                     (VkDeviceMemory)
                     (pMVar34->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object
                     .m_internal,(pMVar34->m_mapping->m_range).offset,
                     (pMVar34->m_mapping->m_range).size,pMVar34->m_atomSize);
        lVar51 = 0x20;
        for (uVar47 = 0; uVar44 = ((long)pMStack_100 - (long)object) / 0x28, uVar47 < uVar44;
            uVar47 = uVar47 + 1) {
          uVar44 = (pMVar34->m_referenceMemory).m_atomSize;
          BitVector::setRange(&(pMVar34->m_referenceMemory).m_flushed,
                              *(ulong *)((long)object + lVar51 + -8) / uVar44,
                              *(ulong *)((long)&object->m_vkd + lVar51) / uVar44,true);
          lVar51 = lVar51 + 0x28;
        }
        pMVar34 = (MemoryObject_conflict *)0x0;
        if (object != pMStack_100) {
          pMVar34 = object;
        }
        VVar33 = (*local_b8->_vptr_DeviceInterface[9])
                           (local_b8,local_b0,uVar44 & 0xffffffff,pMVar34);
        ::vk::checkResult(VVar33,
                          "vkd.flushMappedMemoryRanges(device, (deUint32)ranges.size(), ranges.empty() ? DE_NULL : &ranges[0])"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryMappingTests.cpp"
                          ,0x303);
      }
      else {
        std::vector<vk::VkMappedMemoryRange,_std::allocator<vk::VkMappedMemoryRange>_>::vector
                  ((vector<vk::VkMappedMemoryRange,_std::allocator<vk::VkMappedMemoryRange>_> *)
                   &object,uVar47,(allocator_type *)&object_1);
        randomRanges(pRVar1,(vector<vk::VkMappedMemoryRange,_std::allocator<vk::VkMappedMemoryRange>_>
                             *)&object,uVar47,
                     (VkDeviceMemory)
                     (pMVar34->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object
                     .m_internal,(pMVar34->m_mapping->m_range).offset,
                     (pMVar34->m_mapping->m_range).size,pMVar34->m_atomSize);
        this_02 = &(pMVar34->m_referenceMemory).m_defined;
        for (uVar47 = 0; uVar44 = ((long)pMStack_100 - (long)object) / 0x28, uVar47 < uVar44;
            uVar47 = uVar47 + 1) {
          uVar44 = (&object->m_size)[uVar47 * 5];
          uVar45 = (&object->m_atomSize)[uVar47 * 5];
          sVar42 = (pMVar34->m_referenceMemory).m_atomSize;
          if (sVar42 == 1) {
            uVar45 = uVar45 + uVar44;
            for (; (puVar16 = (pMVar34->m_referenceMemory).m_flushed.m_data.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start, uVar44 < uVar45 &&
                   ((uVar44 & 0x1f) != 0)); uVar44 = uVar44 + 1) {
              bVar25 = (byte)uVar44 & 0x1f;
              if ((puVar16[uVar44 >> 5] >> ((uint)uVar44 & 0x1f) & 1) == 0) {
                value_01 = (undefined1)(0 << bVar25);
              }
              else {
                value_01 = ((this_02->m_data).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar44 >> 5] & 1 << bVar25) != 0;
              }
              BitVector::set(this_02,uVar44,(bool)value_01);
            }
            puVar17 = (this_02->m_data).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            uVar48 = uVar44 >> 3 & 0xfffffffffffffffc;
            for (; uVar44 < (uVar45 & 0xffffffffffffffe0); uVar44 = uVar44 + 0x20) {
              puVar3 = (uint *)((long)puVar17 + uVar48);
              *puVar3 = *puVar3 & *(uint *)((long)puVar16 + uVar48);
              uVar48 = uVar48 + 4;
            }
            for (; uVar44 < uVar45; uVar44 = uVar44 + 1) {
              if (((pMVar34->m_referenceMemory).m_flushed.m_data.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar44 >> 5] >> ((uint)uVar44 & 0x1f) & 1) == 0)
              {
                bVar56 = false;
              }
              else {
                bVar56 = ((this_02->m_data).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar44 >> 5] & 1 << ((byte)uVar44 & 0x1f)
                         ) != 0;
              }
              BitVector::set(this_02,uVar44,bVar56);
            }
          }
          else {
            for (uVar48 = 0; uVar48 < uVar45 / sVar42; uVar48 = uVar48 + 1) {
              uVar41 = uVar44 / sVar42 + uVar48;
              if (((pMVar34->m_referenceMemory).m_flushed.m_data.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar41 >> 5] >> ((uint)uVar41 & 0x1f) & 1) == 0)
              {
                BitVector::setRange(this_02,uVar48 * sVar42 + uVar44,sVar42,false);
                sVar42 = (pMVar34->m_referenceMemory).m_atomSize;
              }
            }
          }
        }
        pMVar34 = (MemoryObject_conflict *)0x0;
        if (object != pMStack_100) {
          pMVar34 = object;
        }
        VVar33 = (*local_b8->_vptr_DeviceInterface[10])
                           (local_b8,local_b0,uVar44 & 0xffffffff,pMVar34);
        ::vk::checkResult(VVar33,
                          "vkd.invalidateMappedMemoryRanges(device, (deUint32)ranges.size(), ranges.empty() ? DE_NULL : &ranges[0])"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryMappingTests.cpp"
                          ,0x310);
      }
      std::_Vector_base<vk::VkMappedMemoryRange,_std::allocator<vk::VkMappedMemoryRange>_>::
      ~_Vector_base((_Vector_base<vk::VkMappedMemoryRange,_std::allocator<vk::VkMappedMemoryRange>_>
                     *)&object);
      goto LAB_00641002;
    }
    if ((first._M_current != last._M_current) &&
       (fVar57 = deRandom_getFloat(&pRVar1->m_rnd), fVar57 < 0.25)) {
      pMVar34 = de::Random::
                choose<vkt::memory::(anonymous_namespace)::MemoryObject*,__gnu_cxx::__normal_iterator<vkt::memory::(anonymous_namespace)::MemoryObject**,std::vector<vkt::memory::(anonymous_namespace)::MemoryObject*,std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject*>>>>
                          (pRVar1,(__normal_iterator<vkt::memory::(anonymous_namespace)::MemoryObject_**,_std::vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>_>
                                   )(this->m_mappedMemoryObjects).
                                    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                           (__normal_iterator<vkt::memory::(anonymous_namespace)::MemoryObject_**,_std::vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>_>
                            )(this->m_mappedMemoryObjects).
                             super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
      object_1 = (MemoryObject_conflict *)pMVar34->m_mapping;
      object = pMVar34;
      memory::(anonymous_namespace)::
      removeFirstEqual<vkt::memory::(anonymous_namespace)::MemoryMapping*>
                (vec,(MemoryMapping **)&object_1);
      (*pMVar34->m_vkd->_vptr_DeviceInterface[8])
                (pMVar34->m_vkd,pMVar34->m_device,
                 (pMVar34->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.
                 m_internal);
      operator_delete(pMVar34->m_mapping,0x20);
      pMVar34->m_mapping = (MemoryMapping *)0x0;
      memory::(anonymous_namespace)::
      removeFirstEqual<vkt::memory::(anonymous_namespace)::MemoryObject*>(vec_00,&object);
      std::
      vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
      ::push_back(&this->m_nonMappedMemoryObjects,&object);
      (this->m_totalMemTracker).m_usage[0] =
           (this->m_totalMemTracker).m_usage[0] - this->m_memoryMappingSysMemSize;
      goto LAB_00641002;
    }
  }
  local_a8 = &this->m_nonMappedMemoryObjects;
  if ((this->m_nonMappedMemoryObjects).
      super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->m_nonMappedMemoryObjects).
      super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar47 = (this->m_memoryLimits).totalSystemMemory;
  }
  else {
    pRVar1 = &this->m_rng;
    fVar57 = deRandom_getFloat(&pRVar1->m_rnd);
    uVar47 = (this->m_memoryLimits).totalSystemMemory;
    if ((fVar57 < 0.5) && (this->m_memoryMappingSysMemSize + lVar51 <= uVar47)) {
      pMVar36 = de::Random::
                choose<vkt::memory::(anonymous_namespace)::MemoryObject*,__gnu_cxx::__normal_iterator<vkt::memory::(anonymous_namespace)::MemoryObject**,std::vector<vkt::memory::(anonymous_namespace)::MemoryObject*,std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject*>>>>
                          (pRVar1,(__normal_iterator<vkt::memory::(anonymous_namespace)::MemoryObject_**,_std::vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>_>
                                   )(this->m_nonMappedMemoryObjects).
                                    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                           (__normal_iterator<vkt::memory::(anonymous_namespace)::MemoryObject_**,_std::vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>_>
                            )(this->m_nonMappedMemoryObjects).
                             super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
      object_1 = pMVar36;
      VVar37 = randomSize(pRVar1,pMVar36->m_atomSize,pMVar36->m_size);
      pMVar38 = (MemoryMapping *)randomOffset(pRVar1,pMVar36->m_atomSize,pMVar36->m_size - VVar37);
      VVar33 = (*local_b8->_vptr_DeviceInterface[7])
                         (local_b8,local_b0,
                          (pMVar36->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.
                          object.m_internal,pMVar38,VVar37,0,&object);
      ::vk::checkResult(VVar33,"vkd.mapMemory(device, *m_memory, offset, size, 0u, &ptr)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryMappingTests.cpp"
                        ,0x2ea);
      pMVar34 = object;
      if (object == (MemoryObject_conflict *)0x0) {
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,(char *)0x0,"ptr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryMappingTests.cpp"
                   ,0x2eb);
LAB_0064119b:
        __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      pMVar39 = (MemoryMapping *)operator_new(0x20);
      (pMVar39->m_range).offset = (VkDeviceSize)pMVar38;
      (pMVar39->m_range).size = VVar37;
      pMVar39->m_ptr = pMVar34;
      pMVar39->m_reference = &pMVar36->m_referenceMemory;
      pMVar36->m_mapping = pMVar39;
      p_Var11 = (_Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
                 *)(this->m_memoryMappings).
                   super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      if (p_Var11 ==
          (_Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
           *)(this->m_memoryMappings).
             super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        this_00 = (_Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
                   *)(vec->
                     super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
                     )._M_impl.super__Vector_impl_data._M_start;
        __n_00 = (long)p_Var11 - (long)this_00;
        if (__n_00 == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar44 = (long)__n_00 >> 3;
        uVar47 = 1;
        if (p_Var11 != this_00) {
          uVar47 = uVar44;
        }
        uVar45 = uVar47 + uVar44;
        if (0xffffffffffffffe < uVar45) {
          uVar45 = 0xfffffffffffffff;
        }
        if (CARRY8(uVar47,uVar44)) {
          uVar45 = 0xfffffffffffffff;
        }
        if (uVar45 == 0) {
          ppMVar43 = (pointer)0x0;
          sVar42 = extraout_RDX;
        }
        else {
          ppMVar43 = (pointer)operator_new(uVar45 * 8);
          sVar42 = extraout_RDX_00;
        }
        ppMVar43[uVar44] = pMVar39;
        if (0 < (long)__n_00) {
          memmove(ppMVar43,this_00,__n_00);
          sVar42 = extraout_RDX_01;
        }
        this = local_a0;
        std::
        _Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
        ::_M_deallocate(this_00,(pointer)((long)(local_a0->m_memoryMappings).
                                                super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)this_00 >> 3),sVar42);
        (this->m_memoryMappings).
        super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
        ._M_impl.super__Vector_impl_data._M_start = ppMVar43;
        (this->m_memoryMappings).
        super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)ppMVar43 + __n_00 + 8);
        (this->m_memoryMappings).
        super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = ppMVar43 + uVar45;
      }
      else {
        (p_Var11->_M_impl).super__Vector_impl_data._M_start = (pointer)pMVar39;
        pppMVar2 = &(this->m_memoryMappings).
                    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppMVar2 = *pppMVar2 + 1;
      }
      std::
      vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
      ::push_back(vec_00,&object_1);
      memory::(anonymous_namespace)::
      removeFirstEqual<vkt::memory::(anonymous_namespace)::MemoryObject*>(local_a8,&object_1);
      (this->m_totalMemTracker).m_usage[0] =
           (this->m_totalMemTracker).m_usage[0] + this->m_memoryMappingSysMemSize;
      goto LAB_00641002;
    }
  }
  nonFullHeaps.
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  nonFullHeaps.
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  nonFullHeaps.
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  nonEmptyHeaps.
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  nonEmptyHeaps.
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  nonEmptyHeaps.
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (uVar47 < lVar51 + this->m_memoryObjectSysMemSize) {
    for (pSVar52 = (this->m_memoryHeaps).
                   super__Vector_base<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>,_std::allocator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        first_01._M_current =
             nonEmptyHeaps.
             super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
             ._M_impl.super__Vector_impl_data._M_start,
        last_01._M_current =
             nonEmptyHeaps.
             super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
             ._M_impl.super__Vector_impl_data._M_finish,
        pSVar52 !=
        (this->m_memoryHeaps).
        super__Vector_base<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>,_std::allocator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; pSVar52 = pSVar52 + 1) {
      pMVar34 = (MemoryObject_conflict *)pSVar52->m_ptr;
      bVar56 = MemoryHeap::empty((MemoryHeap *)pMVar34);
      if (!bVar56) {
        object = pMVar34;
        std::
        vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
        ::push_back(&nonEmptyHeaps,(value_type *)&object);
      }
    }
LAB_006409aa:
    pMVar40 = de::Random::
              choose<vkt::memory::(anonymous_namespace)::MemoryHeap*,__gnu_cxx::__normal_iterator<vkt::memory::(anonymous_namespace)::MemoryHeap**,std::vector<vkt::memory::(anonymous_namespace)::MemoryHeap*,std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap*>>>>
                        (&this->m_rng,first_01,last_01);
    local_c0 = (MemoryHeap *)&pMVar40->m_objects;
    ppMVar14 = (pMVar40->m_objects).
               super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    pMVar34 = (MemoryObject_conflict *)0x0;
    iVar46 = 0;
    for (ppMVar54 = (pMVar40->m_objects).
                    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; pRVar28 = local_a0,
        ppMVar54 != ppMVar14; ppMVar54 = ppMVar54 + 1) {
      if ((iVar46 < 1) || (iVar30 = de::Random::getInt(&this->m_rng,0,iVar46), iVar30 < 1)) {
        pMVar34 = *ppMVar54;
      }
      iVar46 = iVar46 + 1;
    }
    object_1 = pMVar34;
    if ((MemoryObject_conflict *)pMVar34->m_mapping != (MemoryObject_conflict *)0x0) {
      object = (MemoryObject_conflict *)pMVar34->m_mapping;
      memory::(anonymous_namespace)::
      removeFirstEqual<vkt::memory::(anonymous_namespace)::MemoryMapping*>
                (vec,(MemoryMapping **)&object);
      (pRVar28->m_totalMemTracker).m_usage[0] =
           (pRVar28->m_totalMemTracker).m_usage[0] - pRVar28->m_memoryMappingSysMemSize;
    }
    memory::(anonymous_namespace)::
    removeFirstEqual<vkt::memory::(anonymous_namespace)::MemoryObject*>(vec_00,&object_1);
    memory::(anonymous_namespace)::
    removeFirstEqual<vkt::memory::(anonymous_namespace)::MemoryObject*>(local_a8,&object_1);
    object = pMVar34;
    memory::(anonymous_namespace)::
    removeFirstEqual<vkt::memory::(anonymous_namespace)::MemoryObject*>
              ((vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                *)local_c0,&object);
    pMVar40->m_usage = pMVar40->m_usage - pMVar34->m_memoryUsage;
    pTVar15 = pMVar40->m_totalMemTracker;
    pTVar15->m_usage[0] = pTVar15->m_usage[0] - pMVar34->m_referenceMemoryUsage;
    pTVar15->m_usage[(pMVar40->m_heap).flags & 1] =
         pTVar15->m_usage[(pMVar40->m_heap).flags & 1] - pMVar34->m_memoryUsage;
    MemoryObject::~MemoryObject((MemoryObject *)pMVar34);
    operator_delete(pMVar34,0xb0);
    (pRVar28->m_totalMemTracker).m_usage[0] =
         (pRVar28->m_totalMemTracker).m_usage[0] - pRVar28->m_memoryObjectSysMemSize;
  }
  else {
    (this->m_totalMemTracker).m_usage[0] =
         (this->m_totalMemTracker).m_usage[0] + this->m_memoryObjectSysMemSize;
    for (pSVar52 = (this->m_memoryHeaps).
                   super__Vector_base<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>,_std::allocator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        last_00 = nonFullHeaps.
                  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
        first_00 = nonFullHeaps.
                   super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                   ._M_impl.super__Vector_impl_data._M_start,
        last_01._M_current =
             nonEmptyHeaps.
             super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
             ._M_impl.super__Vector_impl_data._M_finish,
        first_01._M_current =
             nonEmptyHeaps.
             super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
             ._M_impl.super__Vector_impl_data._M_start,
        pSVar52 !=
        (this->m_memoryHeaps).
        super__Vector_base<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>,_std::allocator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; pSVar52 = pSVar52 + 1) {
      pMVar34 = (MemoryObject_conflict *)pSVar52->m_ptr;
      bVar56 = MemoryHeap::full((MemoryHeap *)pMVar34);
      if (!bVar56) {
        object = pMVar34;
        std::
        vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
        ::push_back(&nonFullHeaps,(value_type *)&object);
        pMVar34 = (MemoryObject_conflict *)pSVar52->m_ptr;
      }
      bVar56 = MemoryHeap::empty((MemoryHeap *)pMVar34);
      if (!bVar56) {
        object = pMVar34;
        std::
        vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
        ::push_back(&nonEmptyHeaps,(value_type *)&object);
      }
    }
    (this->m_totalMemTracker).m_usage[0] =
         (this->m_totalMemTracker).m_usage[0] - this->m_memoryObjectSysMemSize;
    if ((nonFullHeaps.
         super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         nonFullHeaps.
         super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
         ._M_impl.super__Vector_impl_data._M_finish) ||
       ((nonEmptyHeaps.
         super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         nonEmptyHeaps.
         super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
         ._M_impl.super__Vector_impl_data._M_finish &&
        (fVar57 = deRandom_getFloat(&(this->m_rng).m_rnd), 0.75 <= fVar57)))) goto LAB_006409aa;
    (this->m_totalMemTracker).m_usage[0] =
         (this->m_totalMemTracker).m_usage[0] + this->m_memoryObjectSysMemSize;
    pRVar1 = &this->m_rng;
    pMVar40 = de::Random::
              choose<vkt::memory::(anonymous_namespace)::MemoryHeap*,__gnu_cxx::__normal_iterator<vkt::memory::(anonymous_namespace)::MemoryHeap**,std::vector<vkt::memory::(anonymous_namespace)::MemoryHeap*,std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap*>>>>
                        (pRVar1,(__normal_iterator<vkt::memory::(anonymous_namespace)::MemoryHeap_**,_std::vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>_>
                                 )first_00,
                         (__normal_iterator<vkt::memory::(anonymous_namespace)::MemoryHeap_**,_std::vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>_>
                          )last_00);
    object = (MemoryObject_conflict *)0x0;
    pMStack_100 = (MemoryObject_conflict *)0x0;
    local_f8._M_allocated_capacity = 0;
    uVar47 = ((pMVar40->m_heap).size >> 1) - pMVar40->m_usage;
    local_c0 = (MemoryHeap *)pMVar40->m_limits->totalDeviceLocalMemory;
    uVar49 = (pMVar40->m_heap).flags & 1;
    lVar51 = 8;
    for (uVar44 = 0; pMVar34 = pMStack_100,
        pMVar12 = (pMVar40->m_memoryTypes).
                  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        uVar44 < (ulong)(((long)(pMVar40->m_memoryTypes).
                                super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar12) / 0xc);
        uVar44 = uVar44 + 1) {
      uVar6 = *(uint *)((long)pMVar12 + lVar51 + -4);
      VVar37 = 1;
      if ((uVar6 & 4) == 0) {
        VVar37 = pMVar40->m_nonCoherentAtomSize;
      }
      pPVar13 = pMVar40->m_limits;
      if (uVar49 == 0) {
        VVar53 = 0x1000;
      }
      else {
        VVar53 = pPVar13->devicePageSize;
      }
      uVar7 = *(undefined4 *)((long)pMVar12 + lVar51 + -8);
      if (VVar53 < VVar37) {
        VVar53 = VVar37;
      }
      uVar8 = *(undefined4 *)((long)&pMVar12->index + lVar51);
      uVar45 = VVar37 * 8;
      uVar48 = ((((VVar53 >> 3) + VVar53 + VVar53 / uVar45) - (ulong)(VVar53 % uVar45 == 0)) + 2) -
               (ulong)((VVar53 & 7) == 0);
      pTVar15 = pMVar40->m_totalMemTracker;
      sVar42 = pPVar13->totalSystemMemory;
      if (local_c0 == (MemoryHeap *)0x0) {
        uVar41 = sVar42 - (pTVar15->m_usage[0] + pTVar15->m_usage[1]);
        if ((uVar48 + VVar53 <= uVar41) && (VVar53 <= uVar47)) {
          uVar45 = (uVar41 * uVar45) / (VVar37 * 0x11 + 1);
          local_d8 = (pointer)(uVar45 - uVar45 % VVar53);
          object_1 = (MemoryObject_conflict *)CONCAT44(uVar6,uVar7);
          pMStack_e0 = (MemoryObject_conflict *)CONCAT44(pMStack_e0._4_4_,uVar8);
          std::
          vector<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>,_std::allocator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_>_>
          ::push_back((vector<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>,_std::allocator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_>_>
                       *)&object,(value_type *)&object_1);
        }
      }
      else {
        sVar50 = sVar42;
        if (uVar49 != 0) {
          sVar50 = pPVar13->totalDeviceLocalMemory;
        }
        uVar41 = sVar42 - (pTVar15->m_usage[0] + pTVar15->m_usage[1]);
        if (((uVar48 <= uVar41) && (VVar53 <= uVar47)) &&
           (uVar48 = sVar50 - pTVar15->m_usage[uVar49], VVar53 <= uVar48)) {
          uVar45 = (uVar41 * uVar45) / (VVar37 * 9 + 1);
          if (uVar48 < uVar45) {
            uVar45 = uVar48;
          }
          local_d8 = (pointer)(uVar45 - uVar45 % VVar53);
          object_1 = (MemoryObject_conflict *)CONCAT44(uVar6,uVar7);
          pMStack_e0 = (MemoryObject_conflict *)CONCAT44(pMStack_e0._4_4_,uVar8);
          std::
          vector<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>,_std::allocator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_>_>
          ::push_back((vector<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>,_std::allocator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_>_>
                       *)&object,(value_type *)&object_1);
        }
      }
      lVar51 = lVar51 + 0xc;
    }
    object_1 = (MemoryObject_conflict *)CONCAT44(object_1._4_4_,0xffffffff);
    local_d8 = (pointer)0x0;
    iVar46 = 0;
    for (pMVar36 = object; pVVar27 = local_d8, pMVar26 = object_1, pMVar36 != pMVar34;
        pMVar36 = (MemoryObject_conflict *)&pMVar36->m_size) {
      iVar30 = iVar46;
      if ((iVar46 < 1) || (iVar30 = de::Random::getInt(pRVar1,0,iVar46), iVar30 < 1)) {
        lVar51 = (long)iVar30;
        *(undefined4 *)(&pMStack_e0 + lVar51 * 3) = *(undefined4 *)&pMVar36->m_device;
        (&object_1)[lVar51 * 3] = (MemoryObject_conflict *)pMVar36->m_vkd;
        (&local_d8)[lVar51 * 3] = *(pointer *)&pMVar36->m_memoryTypeIndex;
      }
      iVar46 = iVar46 + 1;
    }
    dVar31 = (deUint32)object_1;
    std::
    vector<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>,_std::allocator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_>_>
    ::~vector((vector<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>,_std::allocator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_>_>
               *)&object);
    if (((ulong)pMVar26 & 0x400000000) == 0) {
      VVar37 = pMVar40->m_nonCoherentAtomSize;
    }
    else {
      VVar37 = 1;
    }
    VVar53 = 0x1000;
    if (((pMVar40->m_heap).flags & 1) != 0) {
      VVar53 = pMVar40->m_limits->devicePageSize;
    }
    local_c0 = pMVar40;
    __n = randomSize(pRVar1,VVar37,(ulong)pVVar27 >> 1);
    if (VVar53 < VVar37) {
      VVar53 = VVar37;
    }
    auVar21._8_8_ = 0;
    auVar21._0_8_ = VVar37;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = __n;
    uVar47 = SUB168(auVar24 / auVar21,0);
    VVar55 = ((((__n >> 3) + __n) - (ulong)((__n & 7) == 0)) + (uVar47 >> 3) + 2) -
             (ulong)((auVar24 / auVar21 & (undefined1  [16])0x7) == (undefined1  [16])0x0);
    pMVar34 = (MemoryObject_conflict *)operator_new(0xb0);
    VVar53 = ((__n / VVar53 + 1) - (ulong)(__n % VVar53 == 0)) * VVar53;
    pMVar34->m_vkd = local_b8;
    pMVar34->m_device = local_b0;
    pMVar34->m_memoryTypeIndex = dVar31;
    pMVar34->m_size = __n;
    pMVar34->m_atomSize = VVar37;
    pMVar34->m_memoryUsage = VVar53;
    pMVar34->m_referenceMemoryUsage = VVar55;
    (pMVar34->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal = 0;
    (pMVar34->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    (pMVar34->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device =
         (VkDevice)0x0;
    (pMVar34->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    pMVar34->m_mapping = (MemoryMapping *)0x0;
    (pMVar34->m_referenceMemory).m_atomSize = VVar37;
    object = (MemoryObject_conflict *)CONCAT71(object._1_7_,0xde);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&(pMVar34->m_referenceMemory).m_bytes,__n,(value_type_conflict5 *)&object,
               (allocator_type *)&object_1);
    BitVector::BitVector(&(pMVar34->m_referenceMemory).m_defined,__n,value);
    BitVector::BitVector(&(pMVar34->m_referenceMemory).m_flushed,uVar47,value_00);
    allocMemory((Move<vk::Handle<(vk::HandleType)7>_> *)&object_1,pMVar34->m_vkd,pMVar34->m_device,
                pMVar34->m_size,pMVar34->m_memoryTypeIndex);
    local_f8._M_allocated_capacity = (size_type)local_d8;
    local_f8._8_8_ = pVStack_d0;
    object = object_1;
    pMStack_100 = pMStack_e0;
    object_1 = (MemoryObject_conflict *)0x0;
    pMStack_e0 = (MemoryObject_conflict *)0x0;
    local_d8 = (pointer)0x0;
    pVStack_d0 = (VkAllocationCallbacks *)0x0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::reset
              (&(pMVar34->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>);
    (pMVar34->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device =
         (VkDevice)local_f8._M_allocated_capacity;
    (pMVar34->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)local_f8._8_8_;
    (pMVar34->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal =
         (deUint64)object;
    (pMVar34->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)pMStack_100;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)7>_> *)&object_1);
    local_c0->m_usage = local_c0->m_usage + VVar53;
    pTVar15 = local_c0->m_totalMemTracker;
    pTVar15->m_usage[(local_c0->m_heap).flags & 1] =
         pTVar15->m_usage[(local_c0->m_heap).flags & 1] + VVar53;
    pTVar15->m_usage[0] = pTVar15->m_usage[0] + VVar55;
    local_38 = pMVar34;
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
    ::push_back(&local_c0->m_objects,&local_38);
    object_2 = pMVar34;
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
    ::push_back(local_a8,&object_2);
  }
  std::
  vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
  ::~vector(&nonEmptyHeaps);
  std::
  vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
  ::~vector(&nonFullHeaps);
LAB_00641002:
  sVar42 = local_a0->m_opNdx + 1;
  local_a0->m_opNdx = sVar42;
  if (sVar42 == 100) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&object,"Pass",(allocator<char> *)&object_1);
    tcu::TestStatus::pass(__return_storage_ptr__,(string *)&object);
    std::__cxx11::string::~string((string *)&object);
  }
  else {
    tcu::TestStatus::incomplete();
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus iterate (void)
	{
		const size_t			opCount						= 100;
		const float				memoryOpProbability			= 0.5f;		// 0.50
		const float				flushInvalidateProbability	= 0.4f;		// 0.20
		const float				mapProbability				= 0.50f;	// 0.15
		const float				unmapProbability			= 0.25f;	// 0.075

		const float				allocProbability			= 0.75f; // Versun free

		const VkDevice			device						= m_context.getDevice();
		const DeviceInterface&	vkd							= m_context.getDeviceInterface();

		const VkDeviceSize		sysMemUsage					= (m_memoryLimits.totalDeviceLocalMemory == 0)
															? m_totalMemTracker.getTotalUsage()
															: m_totalMemTracker.getUsage(MEMORY_CLASS_SYSTEM);

		if (!m_memoryMappings.empty() && m_rng.getFloat() < memoryOpProbability)
		{
			// Perform operations on mapped memory
			MemoryMapping* const	mapping	= m_rng.choose<MemoryMapping*>(m_memoryMappings.begin(), m_memoryMappings.end());

			enum Op
			{
				OP_READ = 0,
				OP_WRITE,
				OP_MODIFY,
				OP_LAST
			};

			const Op op = (Op)(m_rng.getUint32() % OP_LAST);

			switch (op)
			{
				case OP_READ:
					mapping->randomRead(m_rng);
					break;

				case OP_WRITE:
					mapping->randomWrite(m_rng);
					break;

				case OP_MODIFY:
					mapping->randomModify(m_rng);
					break;

				default:
					DE_FATAL("Invalid operation");
			}
		}
		else if (!m_mappedMemoryObjects.empty() && m_rng.getFloat() < flushInvalidateProbability)
		{
			MemoryObject* const	object	= m_rng.choose<MemoryObject*>(m_mappedMemoryObjects.begin(), m_mappedMemoryObjects.end());

			if (m_rng.getBool())
				object->randomFlush(vkd, device, m_rng);
			else
				object->randomInvalidate(vkd, device, m_rng);
		}
		else if (!m_mappedMemoryObjects.empty() && m_rng.getFloat() < unmapProbability)
		{
			// Unmap memory object
			MemoryObject* const	object	= m_rng.choose<MemoryObject*>(m_mappedMemoryObjects.begin(), m_mappedMemoryObjects.end());

			// Remove mapping
			removeFirstEqual(m_memoryMappings, object->getMapping());

			object->unmap();
			removeFirstEqual(m_mappedMemoryObjects, object);
			m_nonMappedMemoryObjects.push_back(object);

			m_totalMemTracker.free(MEMORY_CLASS_SYSTEM, (VkDeviceSize)m_memoryMappingSysMemSize);
		}
		else if (!m_nonMappedMemoryObjects.empty() &&
				 (m_rng.getFloat() < mapProbability) &&
				 (sysMemUsage+m_memoryMappingSysMemSize <= (VkDeviceSize)m_memoryLimits.totalSystemMemory))
		{
			// Map memory object
			MemoryObject* const		object	= m_rng.choose<MemoryObject*>(m_nonMappedMemoryObjects.begin(), m_nonMappedMemoryObjects.end());
			MemoryMapping*			mapping	= object->mapRandom(vkd, device, m_rng);

			m_memoryMappings.push_back(mapping);
			m_mappedMemoryObjects.push_back(object);
			removeFirstEqual(m_nonMappedMemoryObjects, object);

			m_totalMemTracker.allocate(MEMORY_CLASS_SYSTEM, (VkDeviceSize)m_memoryMappingSysMemSize);
		}
		else
		{
			// Sort heaps based on capacity (full or not)
			vector<MemoryHeap*>		nonFullHeaps;
			vector<MemoryHeap*>		nonEmptyHeaps;

			if (sysMemUsage+m_memoryObjectSysMemSize <= (VkDeviceSize)m_memoryLimits.totalSystemMemory)
			{
				// For the duration of sorting reserve MemoryObject space from system memory
				m_totalMemTracker.allocate(MEMORY_CLASS_SYSTEM, (VkDeviceSize)m_memoryObjectSysMemSize);

				for (vector<de::SharedPtr<MemoryHeap> >::const_iterator heapIter = m_memoryHeaps.begin();
					 heapIter != m_memoryHeaps.end();
					 ++heapIter)
				{
					if (!(*heapIter)->full())
						nonFullHeaps.push_back(heapIter->get());

					if (!(*heapIter)->empty())
						nonEmptyHeaps.push_back(heapIter->get());
				}

				m_totalMemTracker.free(MEMORY_CLASS_SYSTEM, (VkDeviceSize)m_memoryObjectSysMemSize);
			}
			else
			{
				// Not possible to even allocate MemoryObject from system memory, look for non-empty heaps
				for (vector<de::SharedPtr<MemoryHeap> >::const_iterator heapIter = m_memoryHeaps.begin();
					 heapIter != m_memoryHeaps.end();
					 ++heapIter)
				{
					if (!(*heapIter)->empty())
						nonEmptyHeaps.push_back(heapIter->get());
				}
			}

			if (!nonFullHeaps.empty() && (nonEmptyHeaps.empty() || m_rng.getFloat() < allocProbability))
			{
				// Reserve MemoryObject from sys mem first
				m_totalMemTracker.allocate(MEMORY_CLASS_SYSTEM, (VkDeviceSize)m_memoryObjectSysMemSize);

				// Allocate more memory objects
				MemoryHeap* const	heap	= m_rng.choose<MemoryHeap*>(nonFullHeaps.begin(), nonFullHeaps.end());
				MemoryObject* const	object	= heap->allocateRandom(vkd, device, m_rng);

				m_nonMappedMemoryObjects.push_back(object);
			}
			else
			{
				// Free memory objects
				MemoryHeap* const		heap	= m_rng.choose<MemoryHeap*>(nonEmptyHeaps.begin(), nonEmptyHeaps.end());
				MemoryObject* const		object	= heap->getRandomObject(m_rng);

				// Remove mapping
				if (object->getMapping())
				{
					removeFirstEqual(m_memoryMappings, object->getMapping());
					m_totalMemTracker.free(MEMORY_CLASS_SYSTEM, m_memoryMappingSysMemSize);
				}

				removeFirstEqual(m_mappedMemoryObjects, object);
				removeFirstEqual(m_nonMappedMemoryObjects, object);

				heap->free(object);
				m_totalMemTracker.free(MEMORY_CLASS_SYSTEM, (VkDeviceSize)m_memoryObjectSysMemSize);
			}
		}

		m_opNdx += 1;
		if (m_opNdx == opCount)
			return tcu::TestStatus::pass("Pass");
		else
			return tcu::TestStatus::incomplete();
	}